

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cport.cc
# Opt level: O2

void __thiscall rcg::CPort::Write(CPort *this,void *buffer,int64_t addr,int64_t length)

{
  GC_ERROR GVar1;
  ostream *poVar2;
  GenTLException *pGVar3;
  size_t size;
  string local_1c0;
  ostringstream out;
  
  size = length;
  if (*this->port == (PORT_HANDLE)0x0) {
    pGVar3 = (GenTLException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&out,"CPort::Write(): Port has been closed",(allocator *)&local_1c0);
    GenTLException::GenTLException(pGVar3,(string *)&out);
    __cxa_throw(pGVar3,&GenTLException::typeinfo,GenTLException::~GenTLException);
  }
  GVar1 = (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->GCWritePort)(*this->port,addr,buffer,&size);
  if (GVar1 == 0) {
    if (size == length) {
      return;
    }
    pGVar3 = (GenTLException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&out,"CPort::Write(): Returned size not as expected",
               (allocator *)&local_1c0);
    GenTLException::GenTLException(pGVar3,(string *)&out);
    __cxa_throw(pGVar3,&GenTLException::typeinfo,GenTLException::~GenTLException);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
  poVar2 = std::operator<<((ostream *)&out,"CPort::Write(address=0x");
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  poVar2 = std::operator<<(poVar2,", length=");
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  std::operator<<(poVar2,")");
  pGVar3 = (GenTLException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  GenTLException::GenTLException(pGVar3,&local_1c0,&this->gentl);
  __cxa_throw(pGVar3,&GenTLException::typeinfo,GenTLException::~GenTLException);
}

Assistant:

void CPort::Write(const void *buffer, int64_t addr, int64_t length)
{
  size_t size=static_cast<size_t>(length);

  if (*port != 0)
  {
    if (gentl->GCWritePort(*port, static_cast<uint64_t>(addr), buffer, &size) !=
        GenTL::GC_ERR_SUCCESS)
    {
      std::ostringstream out;
      out << "CPort::Write(address=0x" << std::hex << addr << ", length=" <<
        std::dec << length << ")";

      throw GenTLException(out.str(), gentl);
    }

    if (size != static_cast<size_t>(length))
    {
      throw GenTLException("CPort::Write(): Returned size not as expected");
    }
  }
  else
  {
    throw GenTLException("CPort::Write(): Port has been closed");
  }
}